

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_color.c
# Opt level: O1

int TIFFYCbCrToRGBInit(TIFFYCbCrToRGB *ycbcr,float *luma,float *refBlackWhite)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  lVar7 = 0;
  _TIFFmemset(ycbcr + 1,0,0x100);
  ycbcr->clamptab = (TIFFRGBValue *)&ycbcr[6].Cb_b_tab;
  do {
    *(char *)((long)&ycbcr[6].Cb_b_tab + lVar7) = (char)lVar7;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x100);
  _TIFFmemset(&ycbcr[0xb].Cb_g_tab,0xff,0x200);
  ycbcr->Cr_r_tab = (int *)&ycbcr[0x16].Cb_b_tab;
  ycbcr->Cb_b_tab = (int *)&ycbcr[0x2b].Cb_g_tab;
  ycbcr->Cr_g_tab = (int32_t *)(ycbcr + 0x41);
  ycbcr->Cb_g_tab = (int32_t *)&ycbcr[0x56].Cb_b_tab;
  ycbcr->Y_tab = (int32_t *)&ycbcr[0x6b].Cb_g_tab;
  fVar13 = *luma;
  fVar12 = 2.0 - (fVar13 + fVar13);
  iVar2 = 0;
  iVar3 = 0;
  if (0.0 <= fVar12) {
    fVar16 = 2.0;
    if (fVar12 <= 2.0) {
      fVar16 = fVar12;
    }
    iVar3 = (int)(fVar16 * 65536.0 + 0.5);
  }
  fVar13 = (fVar13 * fVar12) / luma[1];
  if (0.0 <= fVar13) {
    fVar12 = 2.0;
    if (fVar13 <= 2.0) {
      fVar12 = fVar13;
    }
    iVar2 = (int)(fVar12 * 65536.0 + 0.5);
  }
  fVar13 = luma[2];
  fVar12 = 2.0 - (fVar13 + fVar13);
  iVar5 = 0;
  iVar6 = 0;
  if (0.0 <= fVar12) {
    fVar16 = 2.0;
    if (fVar12 <= 2.0) {
      fVar16 = fVar12;
    }
    iVar6 = (int)(fVar16 * 65536.0 + 0.5);
  }
  fVar13 = (fVar13 * fVar12) / luma[1];
  if (0.0 <= fVar13) {
    fVar12 = 2.0;
    if (fVar13 <= 2.0) {
      fVar12 = fVar13;
    }
    iVar5 = (int)(fVar12 * 65536.0 + 0.5);
  }
  fVar13 = refBlackWhite[4];
  fVar14 = (refBlackWhite[5] + -128.0) - (fVar13 + -128.0);
  uVar9 = -(uint)(fVar14 != 0.0);
  fVar12 = refBlackWhite[2];
  fVar15 = (refBlackWhite[3] + -128.0) - (fVar12 + -128.0);
  uVar10 = -(uint)(fVar15 != 0.0);
  fVar16 = *refBlackWhite;
  fVar17 = refBlackWhite[1] - fVar16;
  uVar11 = -(uint)(fVar17 != 0.0);
  lVar7 = 0;
  do {
    iVar1 = (int)lVar7;
    fVar18 = ((float)((-0x80 - (int)(fVar13 + -128.0)) + iVar1) * 127.0) /
             (float)(~uVar9 & 0x3f800000 | (uint)fVar14 & uVar9);
    fVar19 = 4096.0;
    if (fVar18 <= 4096.0) {
      fVar19 = fVar18;
    }
    iVar4 = (int)(float)(-(uint)(fVar18 < -4096.0) & 0xc5800000 |
                        ~-(uint)(fVar18 < -4096.0) & (uint)fVar19);
    fVar18 = ((float)((-0x80 - (int)(fVar12 + -128.0)) + iVar1) * 127.0) /
             (float)(~uVar10 & 0x3f800000 | (uint)fVar15 & uVar10);
    fVar19 = 4096.0;
    if (fVar18 <= 4096.0) {
      fVar19 = fVar18;
    }
    iVar8 = (int)(float)(-(uint)(fVar18 < -4096.0) & 0xc5800000 |
                        ~-(uint)(fVar18 < -4096.0) & (uint)fVar19);
    *(int *)((long)&ycbcr[0x16].Cb_b_tab + lVar7 * 4) = iVar3 * iVar4 + 0x8000 >> 0x10;
    *(int *)((long)&ycbcr[0x2b].Cb_g_tab + lVar7 * 4) = iVar6 * iVar8 + 0x8000 >> 0x10;
    *(int *)((long)&ycbcr[0x41].clamptab + lVar7 * 4) = -(iVar4 * iVar2);
    fVar18 = ((float)(iVar1 - (int)fVar16) * 255.0) /
             (float)(~uVar11 & 0x3f800000 | (uint)fVar17 & uVar11);
    fVar19 = 4096.0;
    if (fVar18 <= 4096.0) {
      fVar19 = fVar18;
    }
    *(int *)((long)&ycbcr[0x56].Cb_b_tab + lVar7 * 4) = 0x8000 - iVar8 * iVar5;
    *(int *)((long)&ycbcr[0x6b].Cb_g_tab + lVar7 * 4) =
         (int)(float)(-(uint)(fVar18 < -4096.0) & 0xc5800000 |
                     ~-(uint)(fVar18 < -4096.0) & (uint)fVar19);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x100);
  return 0;
}

Assistant:

int TIFFYCbCrToRGBInit(TIFFYCbCrToRGB *ycbcr, float *luma, float *refBlackWhite)
{
    TIFFRGBValue *clamptab;
    int i;

#define LumaRed luma[0]
#define LumaGreen luma[1]
#define LumaBlue luma[2]

    clamptab =
        (TIFFRGBValue *)((uint8_t *)ycbcr +
                         TIFFroundup_32(sizeof(TIFFYCbCrToRGB), sizeof(long)));
    _TIFFmemset(clamptab, 0, 256); /* v < 0 => 0 */
    ycbcr->clamptab = (clamptab += 256);
    for (i = 0; i < 256; i++)
        clamptab[i] = (TIFFRGBValue)i;
    _TIFFmemset(clamptab + 256, 255, 2 * 256); /* v > 255 => 255 */
    ycbcr->Cr_r_tab = (int *)(clamptab + 3 * 256);
    ycbcr->Cb_b_tab = ycbcr->Cr_r_tab + 256;
    ycbcr->Cr_g_tab = (int32_t *)(ycbcr->Cb_b_tab + 256);
    ycbcr->Cb_g_tab = ycbcr->Cr_g_tab + 256;
    ycbcr->Y_tab = ycbcr->Cb_g_tab + 256;

    {
        float f1 = 2 - 2 * LumaRed;
        int32_t D1 = FIX(CLAMP(f1, 0.0F, 2.0F));
        float f2 = LumaRed * f1 / LumaGreen;
        int32_t D2 = -FIX(CLAMP(f2, 0.0F, 2.0F));
        float f3 = 2 - 2 * LumaBlue;
        int32_t D3 = FIX(CLAMP(f3, 0.0F, 2.0F));
        float f4 = LumaBlue * f3 / LumaGreen;
        int32_t D4 = -FIX(CLAMP(f4, 0.0F, 2.0F));
        int x;

#undef LumaBlue
#undef LumaGreen
#undef LumaRed

        /*
         * i is the actual input pixel value in the range 0..255
         * Cb and Cr values are in the range -128..127 (actually
         * they are in a range defined by the ReferenceBlackWhite
         * tag) so there is some range shifting to do here when
         * constructing tables indexed by the raw pixel data.
         */
        for (i = 0, x = -128; i < 256; i++, x++)
        {
            int32_t Cr = (int32_t)CLAMPw(Code2V(x, refBlackWhite[4] - 128.0F,
                                                refBlackWhite[5] - 128.0F, 127),
                                         -128.0F * 32, 128.0F * 32);
            int32_t Cb = (int32_t)CLAMPw(Code2V(x, refBlackWhite[2] - 128.0F,
                                                refBlackWhite[3] - 128.0F, 127),
                                         -128.0F * 32, 128.0F * 32);

            ycbcr->Cr_r_tab[i] = (int32_t)((D1 * Cr + ONE_HALF) >> SHIFT);
            ycbcr->Cb_b_tab[i] = (int32_t)((D3 * Cb + ONE_HALF) >> SHIFT);
            ycbcr->Cr_g_tab[i] = D2 * Cr;
            ycbcr->Cb_g_tab[i] = D4 * Cb + ONE_HALF;
            ycbcr->Y_tab[i] = (int32_t)CLAMPw(
                Code2V(x + 128, refBlackWhite[0], refBlackWhite[1], 255),
                -128.0F * 32, 128.0F * 32);
        }
    }

    return 0;
}